

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

Statement *
slang::ast::WaitStatement::fromSyntax
          (Compilation *compilation,WaitStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  ExpressionSyntax *pEVar1;
  StatementSyntax *pSVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SourceLocation SVar5;
  InvalidStatement *pIVar6;
  char *func;
  SourceRange sourceRange;
  SourceRange local_40;
  Expression *args;
  
  pEVar1 = (syntax->expr).ptr;
  if (pEVar1 == (ExpressionSyntax *)0x0) {
    func = 
    "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
    ;
  }
  else {
    iVar4 = Expression::bind((int)pEVar1,(sockaddr *)context,0);
    args = (Expression *)CONCAT44(extraout_var,iVar4);
    pSVar2 = (syntax->statement).ptr;
    if (pSVar2 != (StatementSyntax *)0x0) {
      iVar4 = Statement::bind((int)pSVar2,(sockaddr *)context,(socklen_t)stmtCtx);
      local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      SVar5 = (SourceLocation)
              BumpAllocator::
              emplace<slang::ast::WaitStatement,slang::ast::Expression_const&,slang::ast::Statement_const&,slang::SourceRange>
                        (&compilation->super_BumpAllocator,args,
                         (Statement *)CONCAT44(extraout_var_00,iVar4),&local_40);
      bVar3 = Expression::bad(args);
      if ((!bVar3) && (((Statement *)CONCAT44(extraout_var_00,iVar4))->kind != Invalid)) {
        bVar3 = ASTContext::requireBooleanConvertible(context,args);
        if (bVar3) {
          if ((((context->flags).m_bits & 0x6000) == 0) &&
             (bVar3 = ASTContext::inAlwaysCombLatch(context), !bVar3)) {
            return (Statement *)SVar5;
          }
          sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          ASTContext::addDiag(context,(DiagCode)0x460008,sourceRange);
        }
      }
      local_40.startLoc = SVar5;
      pIVar6 = BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                         (&compilation->super_BumpAllocator,(Statement **)&local_40);
      return &pIVar6->super_Statement;
    }
    func = 
    "T slang::not_null<slang::syntax::StatementSyntax *>::get() const [T = slang::syntax::StatementSyntax *]"
    ;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

Statement& WaitStatement::fromSyntax(Compilation& compilation, const WaitStatementSyntax& syntax,
                                     const ASTContext& context, StatementContext& stmtCtx) {
    auto& cond = Expression::bind(*syntax.expr, context);
    auto& stmt = Statement::bind(*syntax.statement, context, stmtCtx);
    auto result = compilation.emplace<WaitStatement>(cond, stmt, syntax.sourceRange());
    if (cond.bad() || stmt.bad())
        return badStmt(compilation, result);

    if (!context.requireBooleanConvertible(cond))
        return badStmt(compilation, result);

    if (context.flags.has(ASTFlags::Function | ASTFlags::Final) || context.inAlwaysCombLatch()) {
        context.addDiag(diag::TimingInFuncNotAllowed, syntax.sourceRange());
        return badStmt(compilation, result);
    }

    return *result;
}